

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O2

int32_t protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_a
                  (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *msg)

{
  bool bVar1;
  int32_t ret;
  int32_t default_val;
  upb_MiniTableField field;
  int32_t local_28 [2];
  int32_t local_20 [2];
  upb_MiniTableField local_18;
  
  local_20[0] = 0;
  local_18.number_dont_copy_me__upb_internal_use_only = 1;
  local_18.offset_dont_copy_me__upb_internal_use_only = 0xc;
  local_18.presence = 0x40;
  local_18.submsg_index_dont_copy_me__upb_internal_use_only = 0xffff;
  local_18.descriptortype_dont_copy_me__upb_internal_use_only = '\x05';
  local_18.mode_dont_copy_me__upb_internal_use_only = 'B';
  bVar1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(&local_18,local_20);
  if ((!bVar1) &&
     (bVar1 = upb_Message_HasBaseField(&msg->base_dont_copy_me__upb_internal_use_only,&local_18),
     !bVar1)) {
    return local_20[0];
  }
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
            (&local_18,local_28,
             (void *)((long)&(msg->base_dont_copy_me__upb_internal_use_only).field_0 +
                     ((ulong)local_18._0_8_ >> 0x20 & 0xffff)));
  return local_28[0];
}

Assistant:

UPB_INLINE int32_t protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_a(const protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* msg) {
  int32_t default_val = (int32_t)0;
  int32_t ret;
  const upb_MiniTableField field = {1, 12, 64, kUpb_NoSub, 5, (int)kUpb_FieldMode_Scalar | ((int)kUpb_FieldRep_4Byte << kUpb_FieldRep_Shift)};
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}